

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateRandomUniformDynamicLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  float *pfVar1;
  bool bVar2;
  undefined1 *puVar3;
  Result *_result;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (bVar2) {
    std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar2 = Result::good(__return_storage_ptr__);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&__return_storage_ptr__->m_message);
      if (layer->_oneof_case_[0] == 0x4b0) {
        puVar3 = *(undefined1 **)&layer->layer_;
      }
      else {
        puVar3 = Specification::_RandomUniformDynamicLayerParams_default_instance_;
      }
      pfVar1 = (float *)((long)&(((ConvolutionLayerParams *)puVar3)->kernelsize_).arena_or_elements_
                        + 4);
      if (((UnaryFunctionLayerParams *)puVar3)->epsilon_ < *pfVar1 ||
          ((UnaryFunctionLayerParams *)puVar3)->epsilon_ == *pfVar1) {
        Result::Result(__return_storage_ptr__);
      }
      else {
        std::operator+(&local_38,"Value of minval should be smaller than maxval for \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::operator+(&err,&local_38,"\' layer.");
        std::__cxx11::string::~string((string *)&local_38);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
        std::__cxx11::string::~string((string *)&err);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateRandomUniformDynamicLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    const auto& params = layer.randomuniformdynamic();
    if (params.minval() > params.maxval()) {
        const std::string err = "Value of minval should be smaller than maxval for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}